

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttribKernelT.hh
# Opt level: O2

void __thiscall
OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
request_face_normals
          (AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *this
          )

{
  uint uVar1;
  string local_40;
  allocator local_19;
  
  uVar1 = this->refcount_fnormals_;
  this->refcount_fnormals_ = uVar1 + 1;
  if (uVar1 == 0) {
    std::__cxx11::string::string((string *)&local_40,"f:normals",&local_19);
    BaseKernel::add_property<OpenMesh::VectorT<double,3>>
              ((BaseKernel *)this,&this->face_normals_,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void request_face_normals()
  {
    if (!refcount_fnormals_++)
      this->add_property( face_normals_, "f:normals" );
  }